

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O1

void __thiscall
agge::tests::GenericRGBXBlenderTests::GenericRGBXBlenderTests(GenericRGBXBlenderTests *this)

{
  registry *prVar1;
  
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)
                    BlendingWhiteOnBlackProducesGrayDependingOnCover,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)
                    BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)BlendingFullyOpaquePixelIsCopied,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)BlendingHalfOpaquePixelIsBlended,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)BlendingSeriesOfCoversIsSupported,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)AlphaIsMixedFromSrcAlphaAndCover,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)
                    PixelCopyAppliesRequiredAmountOfPixels,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::GenericRGBXBlenderTests>
            (prVar1,(offset_in_GenericRGBXBlenderTests_to_subr)
                    PixelComponentsAreSetAccordinglyToOrderOnCopy,(char *)0x0);
  return;
}

Assistant:

test( BlendingWhiteOnBlackProducesGrayDependingOnCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel black = { };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> whiteness(color::make(0xFF, 0xFF, 0xFF));
				pixel dest[n];

				fill_n(dest, n, black);

				// ACT
				whiteness(dest + 0, 0, 0, 1, covers + 0);
				whiteness(dest + 1, 0, 0, 1, covers + 1);
				whiteness(dest + 2, 0, 0, 1, covers + 2);
				whiteness(dest + 3, 0, 0, 1, covers + 3);
				whiteness(dest + 4, 0, 0, 1, covers + 4);
				whiteness(dest + 5, 0, 0, 1, covers + 5);
				whiteness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0x00, 0x00, 0x00, 0x00 } },
					{ { 0x11, 0x11, 0x11, 0x11 } },
					{ { 0x20, 0x20, 0x20, 0x20 } },
					{ { 0x70, 0x70, 0x70, 0x70 } },
					{ { 0x80, 0x80, 0x80, 0x80 } },
					{ { 0xEF, 0xEF, 0xEF, 0xEF } },
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
				};

				assert_equal(reference, dest);
			}